

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

int Spl_ManLutMffcSize(Gia_Man_t *p,int iObj,Vec_Int_t *vTemp,Vec_Bit_t *vMarksAnd)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int local_2c;
  
  local_2c = iObj;
  if ((-1 < iObj) && (iObj < p->vMapping2->nSize)) {
    if (p->vMapping2->pArray[(uint)iObj].nSize == 0) {
      __assert_fail("Gia_ObjIsLut2(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                    ,0x1ba,"int Spl_ManLutMffcSize(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *)");
    }
    Gia_ManIncrementTravId(p);
    if (iObj < p->vMapping2->nSize) {
      Gia_ManCollectAnds(p,&local_2c,1,vTemp,p->vMapping2->pArray + (uint)iObj);
      uVar4 = vTemp->nSize;
      if ((int)uVar4 < 1) {
        uVar3 = 0;
      }
      else {
        piVar2 = vTemp->pArray;
        lVar6 = 0;
        uVar3 = 0;
        do {
          uVar1 = piVar2[lVar6];
          if (((int)uVar1 < 0) || (vMarksAnd->nSize <= (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          if (((uint)vMarksAnd->pArray[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) {
            if (((int)uVar3 < 0) || (uVar4 <= uVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar5 = (ulong)uVar3;
            uVar3 = uVar3 + 1;
            piVar2[uVar5] = uVar1;
            uVar4 = vTemp->nSize;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)uVar4);
      }
      if ((int)uVar4 < (int)uVar3) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vTemp->nSize = uVar3;
      return uVar3;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Spl_ManLutMffcSize( Gia_Man_t * p, int iObj, Vec_Int_t * vTemp, Vec_Bit_t * vMarksAnd )
{
    int iTemp, i, k = 0;
    assert( Gia_ObjIsLut2(p, iObj) );
//Vec_IntPrint( Gia_ObjLutFanins2(p, iObj) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, &iObj, 1, vTemp, Gia_ObjLutFanins2(p, iObj) );
    Vec_IntForEachEntry( vTemp, iTemp, i )
        if ( !Vec_BitEntry(vMarksAnd, iTemp) )
            Vec_IntWriteEntry( vTemp, k++, iTemp );
    Vec_IntShrink( vTemp, k );
    return k;
}